

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O2

bool __thiscall
cmParseCoberturaCoverage::ReadCoverageXML(cmParseCoberturaCoverage *this,char *xmlFile)

{
  XMLParser parser;
  XMLParser XStack_88;
  
  XMLParser::XMLParser(&XStack_88,this->CTest,this->Coverage);
  cmXMLParser::ParseFile(&XStack_88.super_cmXMLParser,xmlFile);
  XMLParser::~XMLParser(&XStack_88);
  return true;
}

Assistant:

bool cmParseCoberturaCoverage::ReadCoverageXML(const char* xmlFile)
{
  cmParseCoberturaCoverage::XMLParser parser(this->CTest, this->Coverage);
  parser.ParseFile(xmlFile);
  return true;
}